

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblemenu.cpp
# Opt level: O3

QAccessibleInterface * getOrCreateMenu(QWidget *menu,QAction *action)

{
  QAccessibleInterface *pQVar1;
  undefined8 uVar2;
  
  pQVar1 = (QAccessibleInterface *)QAccessible::queryAccessibleInterface((QObject *)action);
  if (pQVar1 == (QAccessibleInterface *)0x0) {
    pQVar1 = (QAccessibleInterface *)operator_new(0x28);
    *(undefined ***)pQVar1 = &PTR__QAccessibleMenuItem_00806e50;
    *(undefined ***)(pQVar1 + 8) = &PTR__QAccessibleMenuItem_00806f20;
    *(QAction **)(pQVar1 + 0x10) = action;
    if (menu == (QWidget *)0x0) {
      uVar2 = 0;
    }
    else {
      uVar2 = QtSharedPointer::ExternalRefCountData::getAndRef(&menu->super_QObject);
    }
    *(undefined8 *)(pQVar1 + 0x18) = uVar2;
    *(QWidget **)(pQVar1 + 0x20) = menu;
    QAccessible::registerAccessibleInterface(pQVar1);
  }
  return pQVar1;
}

Assistant:

QAccessibleInterface *getOrCreateMenu(QWidget *menu, QAction *action)
{
    QAccessibleInterface *iface = QAccessible::queryAccessibleInterface(action);
    if (!iface) {
        iface = new QAccessibleMenuItem(menu, action);
        QAccessible::registerAccessibleInterface(iface);
    }
    return iface;
}